

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_functionActivationEnvironment_create
          (sysbvm_context_t *context,sysbvm_tuple_t parent,sysbvm_tuple_t function)

{
  undefined8 uVar1;
  _Bool _Var2;
  sysbvm_object_tuple_t *psVar3;
  sysbvm_tuple_t sVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  uint64_t value;
  
  if (function != 0) {
    _Var2 = sysbvm_tuple_isFunction((sysbvm_context_t *)function,parent);
    if (_Var2) goto LAB_0010aebc;
  }
  sysbvm_error("Expected a function");
LAB_0010aebc:
  lVar7 = *(long *)(function + 0x48);
  if (lVar7 == 0) {
    sysbvm_error("Expected a function with a definition.");
    lVar7 = *(long *)(function + 0x48);
  }
  lVar6 = *(long *)(lVar7 + 0x78);
  if (lVar6 == 0) {
    sysbvm_error("Expected an analyzed source definition");
    lVar6 = *(long *)(lVar7 + 0x78);
  }
  psVar3 = sysbvm_context_allocatePointerTuple
                     (context,(context->roots).functionActivationEnvironmentType,0x13);
  psVar3[2].header.field_0.typePointer = parent;
  psVar3[5].header.field_0.typePointer = function;
  uVar1 = *(undefined8 *)(function + 0x48);
  psVar3[5].header.identityHashAndFlags = (int)uVar1;
  psVar3[5].header.objectSize = (int)((ulong)uVar1 >> 0x20);
  uVar1 = *(undefined8 *)(function + 0x38);
  psVar3[6].header.identityHashAndFlags = (int)uVar1;
  psVar3[6].header.objectSize = (int)((ulong)uVar1 >> 0x20);
  uVar5 = *(ulong *)(lVar6 + 0x28);
  if ((uVar5 & 0xf) == 0 && uVar5 != 0) {
    value = (uint64_t)(*(uint *)(uVar5 + 0xc) >> 3);
  }
  else {
    value = 0;
  }
  uVar5 = *(ulong *)(lVar6 + 0x30);
  if ((uVar5 & 0xf) == 0 && uVar5 != 0) {
    uVar5 = (ulong)(*(uint *)(uVar5 + 0xc) >> 3);
  }
  else {
    uVar5 = 0;
  }
  sVar4 = sysbvm_tuple_uint64_encode(context,value);
  psVar3[6].header.field_0.typePointer = sVar4;
  sVar4 = sysbvm_array_create(context,uVar5 + value);
  psVar3[6].field_1.pointers[0] = sVar4;
  return (sysbvm_tuple_t)psVar3;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionActivationEnvironment_create(sysbvm_context_t *context, sysbvm_tuple_t parent, sysbvm_tuple_t function)
{
    if(!function || !sysbvm_tuple_isFunction(context, function))
        sysbvm_error("Expected a function");

    sysbvm_function_t *functionObject = (sysbvm_function_t*)function;
    if(!functionObject->definition)
        sysbvm_error("Expected a function with a definition.");

    sysbvm_functionDefinition_t *functionDefinitionObject = (sysbvm_functionDefinition_t*)functionObject->definition;
    if(!functionDefinitionObject->sourceAnalyzedDefinition)
        sysbvm_error("Expected an analyzed source definition");

    sysbvm_functionSourceAnalyzedDefinition_t *sourceAnalyzedDefinition = (sysbvm_functionSourceAnalyzedDefinition_t*)functionDefinitionObject->sourceAnalyzedDefinition;

    sysbvm_functionActivationEnvironment_t *result = (sysbvm_functionActivationEnvironment_t*)sysbvm_context_allocatePointerTuple(context, context->roots.functionActivationEnvironmentType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_functionActivationEnvironment_t));
    result->super.super.parent = parent;
    result->function = function;
    result->functionDefinition = functionObject->definition;
    result->captureVector = functionObject->captureVector;
    
    size_t argumentCount = sysbvm_array_getSize(sourceAnalyzedDefinition->arguments);
    size_t localCount = sysbvm_array_getSize(sourceAnalyzedDefinition->locals);
    result->argumentVectorSize = sysbvm_tuple_size_encode(context, argumentCount);
    result->valueVector = sysbvm_array_create(context, argumentCount + localCount);
    return (sysbvm_tuple_t)result;
}